

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O1

void __thiscall
double_conversion::DoubleToStringConverter::CreateExponentialRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int exponent,
          StringBuilder *result_builder)

{
  char cVar1;
  int iVar2;
  ulong in_RAX;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  char buffer [6];
  undefined8 local_28;
  
  cVar1 = *decimal_digits;
  iVar7 = result_builder->position_;
  result_builder->position_ = iVar7 + 1;
  (result_builder->buffer_).start_[iVar7] = cVar1;
  local_28 = in_RAX;
  if (length != 1) {
    iVar7 = result_builder->position_;
    result_builder->position_ = iVar7 + 1;
    (result_builder->buffer_).start_[iVar7] = '.';
    memmove((result_builder->buffer_).start_ + result_builder->position_,decimal_digits + 1,
            (long)(length + -1));
    result_builder->position_ = result_builder->position_ + length + -1;
  }
  cVar1 = this->exponent_character_;
  iVar7 = result_builder->position_;
  result_builder->position_ = iVar7 + 1;
  (result_builder->buffer_).start_[iVar7] = cVar1;
  if (exponent < 0) {
    iVar7 = result_builder->position_;
    result_builder->position_ = iVar7 + 1;
    (result_builder->buffer_).start_[iVar7] = '-';
    exponent = -exponent;
  }
  else if ((this->flags_ & 1) != 0) {
    iVar7 = result_builder->position_;
    result_builder->position_ = iVar7 + 1;
    (result_builder->buffer_).start_[iVar7] = '+';
  }
  if (exponent == 0) {
    iVar7 = result_builder->position_;
    result_builder->position_ = iVar7 + 1;
    (result_builder->buffer_).start_[iVar7] = '0';
  }
  else {
    local_28 = local_28 & 0xffffffffffffff;
    iVar7 = 5;
    if (0 < exponent) {
      lVar8 = 4;
      do {
        *(byte *)((long)&local_28 + lVar8 + 2) =
             (char)exponent + (char)((uint)exponent / 10) * -10 | 0x30;
        lVar8 = lVar8 + -1;
        bVar9 = 9 < (uint)exponent;
        exponent = (uint)exponent / 10;
      } while (bVar9);
      iVar7 = (int)lVar8 + 1;
    }
    iVar6 = this->min_exponent_width_;
    if (4 < iVar6) {
      iVar6 = 5;
    }
    iVar2 = 5 - iVar7;
    if (iVar2 < iVar6) {
      uVar5 = (ulong)((iVar7 + iVar6) - 6);
      memset((void *)((long)&local_28 + ((long)(iVar7 + -1) - uVar5) + 2),0x30,uVar5 + 1);
      lVar3 = (long)iVar6;
      lVar4 = 5 - (long)iVar7;
      lVar8 = 6 - (long)iVar7;
      if (lVar8 < lVar3) {
        lVar8 = lVar3;
      }
      iVar7 = 5 - (int)lVar8;
      do {
        lVar4 = lVar4 + 1;
      } while (lVar4 < lVar3);
      iVar2 = 5 - iVar7;
    }
    memcpy((result_builder->buffer_).start_ + result_builder->position_,
           (void *)((long)&local_28 + (long)iVar7 + 2),(long)iVar2);
    result_builder->position_ = result_builder->position_ + iVar2;
  }
  return;
}

Assistant:

void DoubleToStringConverter::CreateExponentialRepresentation(
    const char* decimal_digits,
    int length,
    int exponent,
    StringBuilder* result_builder) const {
  DOUBLE_CONVERSION_ASSERT(length != 0);
  result_builder->AddCharacter(decimal_digits[0]);
  if (length != 1) {
    result_builder->AddCharacter('.');
    result_builder->AddSubstring(&decimal_digits[1], length-1);
  }
  result_builder->AddCharacter(exponent_character_);
  if (exponent < 0) {
    result_builder->AddCharacter('-');
    exponent = -exponent;
  } else {
    if ((flags_ & EMIT_POSITIVE_EXPONENT_SIGN) != 0) {
      result_builder->AddCharacter('+');
    }
  }
  if (exponent == 0) {
    result_builder->AddCharacter('0');
    return;
  }
  DOUBLE_CONVERSION_ASSERT(exponent < 1e4);
  // Changing this constant requires updating the comment of DoubleToStringConverter constructor
  const int kMaxExponentLength = 5;
  char buffer[kMaxExponentLength + 1];
  buffer[kMaxExponentLength] = '\0';
  int first_char_pos = kMaxExponentLength;
  while (exponent > 0) {
    buffer[--first_char_pos] = '0' + (exponent % 10);
    exponent /= 10;
  }
  // Add prefix '0' to make exponent width >= min(min_exponent_with_, kMaxExponentLength)
  // For example: convert 1e+9 -> 1e+09, if min_exponent_with_ is set to 2
  while(kMaxExponentLength - first_char_pos < std::min(min_exponent_width_, kMaxExponentLength)) {
    buffer[--first_char_pos] = '0';
  }
  result_builder->AddSubstring(&buffer[first_char_pos],
                               kMaxExponentLength - first_char_pos);
}